

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::mouseMoveEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  SubControl SVar1;
  int iVar2;
  int iVar3;
  QMdiSubWindowPrivate *this_00;
  QWidget *pQVar4;
  QWidgetData *pQVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  SubControl SVar9;
  int iVar10;
  Operation OVar11;
  QStyle *pQVar12;
  QProxyStyle *this_01;
  long lVar13;
  QPoint QVar14;
  long in_FS_OFFSET;
  double dVar15;
  double dVar16;
  QRect QVar17;
  undefined1 auVar18 [16];
  QRegion hoverRegion;
  QStyleOptionTitleBar options;
  QStyleOptionTitleBar titleBarOptions;
  QRegion local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  QPalettePrivate *pQStack_f0;
  undefined1 *local_e8;
  QObject *pQStack_e0;
  undefined1 *local_d8;
  QArrayData *pQStack_d0;
  char16_t *local_c8;
  undefined1 *puStack_c0;
  QIcon local_b8;
  undefined1 *puStack_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidget::mouseMoveEvent(&this->super_QWidget,mouseEvent);
      return;
    }
    goto LAB_0045217d;
  }
  if (this_00->currentOperation == None) {
    local_b8.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_d0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_e0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_f0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
    local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_118._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_118,this_00);
    SVar1 = this_00->hoveredSubControl;
    auVar18 = QEventPoint::position();
    dVar16 = (double)((ulong)auVar18._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar18._0_8_;
    bVar6 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    dVar15 = (double)((ulong)auVar18._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar18._8_8_;
    bVar7 = 2147483647.0 < dVar15;
    if (dVar15 <= -2147483648.0) {
      dVar15 = -2147483648.0;
    }
    local_120.d = (QRegionData *)
                  CONCAT44((int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 |
                                        ~-(ulong)bVar7 & (ulong)dVar15),
                           (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 |
                                        ~-(ulong)bVar6 & (ulong)dVar16));
    pQVar4 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_00);
    pQVar12 = QWidget::style(pQVar4);
    SVar9 = (**(code **)(*(long *)pQVar12 + 0xd0))
                      (pQVar12,5,(QStyleOptionTitleBar *)local_a8,&local_120,pQVar4);
    QIcon::~QIcon(&local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
    this_00->hoveredSubControl = SVar9;
    local_120.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_120);
    QVar17.x2.m_i = local_a8._8_4_;
    QVar17.y2.m_i = local_a8._12_4_;
    QVar17.x1.m_i = local_a8._0_4_;
    QVar17.y1.m_i = local_a8._4_4_;
    SVar9 = this_00->hoveredSubControl;
    if ((SVar1 & ~SC_TitleBarLabel) == SC_None) {
LAB_00451dfd:
      if (SVar9 != SVar1 && (SVar9 & ~SC_TitleBarLabel) != SC_None) {
        local_a8 = (undefined1  [16])QVar17;
        pQVar12 = QWidget::style(&this->super_QWidget);
        QVar17 = (QRect)(**(code **)(*(long *)pQVar12 + 0xd8))
                                  (pQVar12,5,local_118,this_00->hoveredSubControl,this);
        local_a8 = (undefined1  [16])QVar17;
        QRegion::operator+=(&local_120,(QRect *)local_a8);
        QVar17 = (QRect)local_a8;
      }
    }
    else if (SVar1 != SVar9) {
      pQVar12 = QWidget::style(&this->super_QWidget);
      local_a8 = (**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,5,local_118,SVar1,this);
      QRegion::operator+=(&local_120,(QRect *)local_a8);
      SVar9 = this_00->hoveredSubControl;
      QVar17 = (QRect)local_a8;
      goto LAB_00451dfd;
    }
    local_a8 = (undefined1  [16])QVar17;
    pQVar12 = QWidget::style(&this->super_QWidget);
    this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
    if (this_01 != (QProxyStyle *)0x0) {
      pQVar12 = QProxyStyle::baseStyle(this_01);
    }
    lVar13 = (**(code **)(*(long *)pQVar12 + 8))(pQVar12,"QMacStyle");
    if (lVar13 != 0) {
      cVar8 = QRegion::isEmpty();
      if (cVar8 == '\0') {
        pQVar5 = (this->super_QWidget).data;
        iVar2 = (pQVar5->crect).x2.m_i;
        iVar3 = (pQVar5->crect).x1.m_i;
        iVar10 = QMdiSubWindowPrivate::titleBarHeight(this_00,(QStyleOptionTitleBar *)local_118);
        QRegion::QRegion((QRegion *)local_a8,0,0,(iVar2 - iVar3) + 1,iVar10,Rectangle);
        QRegion::operator+=(&local_120,(QRegion *)local_a8);
        QRegion::~QRegion((QRegion *)local_a8);
      }
    }
    cVar8 = QRegion::isEmpty();
    if (cVar8 == '\0') {
      QWidget::update(&this->super_QWidget,&local_120);
    }
    QRegion::~QRegion(&local_120);
    QIcon::~QIcon(&local_b8);
    if (pQStack_d0 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_d0,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_118);
  }
  if ((((byte)mouseEvent[0x44] & 1) == 0) && (this_00->isInInteractiveMode != true)) {
    auVar18 = QEventPoint::position();
    dVar16 = (double)((ulong)auVar18._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar18._0_8_;
    bVar6 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    local_a8._0_4_ =
         (undefined4)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar16);
    dVar16 = (double)((ulong)auVar18._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar18._8_8_;
    bVar6 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    local_a8._4_4_ =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar16);
    OVar11 = QMdiSubWindowPrivate::getOperation(this_00,(QPoint *)local_a8);
    this_00->currentOperation = OVar11;
    if (OVar11 < TopResize) {
      if (OVar11 == Move) {
        cVar8 = this_00->moveEnabled;
        goto joined_r0x00452144;
      }
    }
    else {
      cVar8 = this_00->resizeEnabled;
joined_r0x00452144:
      if (cVar8 == '\0') {
        this_00->currentOperation = None;
      }
    }
    QMdiSubWindowPrivate::updateCursor(this_00);
  }
  else if (this_00->currentOperation < TopResize) {
    if ((this_00->currentOperation == Move) && (this_00->moveEnabled == true)) goto LAB_00451fc3;
  }
  else if (this_00->resizeEnabled != false) {
LAB_00451fc3:
    pQVar4 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    auVar18 = QEventPoint::globalPosition();
    dVar16 = (double)((ulong)auVar18._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar18._0_8_;
    bVar6 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    local_118._0_4_ =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar16);
    dVar16 = (double)((ulong)auVar18._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar18._8_8_;
    bVar6 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    local_118._4_4_ =
         (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar16);
    QVar14 = QWidget::mapFromGlobal(pQVar4,(QPoint *)local_118);
    local_a8._0_8_ = QVar14;
    QMdiSubWindowPrivate::setNewGeometry(this_00,(QPoint *)local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0045217d:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::mouseMoveEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseMoveEvent(mouseEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    // No update needed if we're in a move/resize operation.
    if (!d->isMoveOperation() && !d->isResizeOperation()) {
        // Find previous and current hover region.
        const QStyleOptionTitleBar options = d->titleBarOptions();
        QStyle::SubControl oldHover = d->hoveredSubControl;
        d->hoveredSubControl = d->getSubControl(mouseEvent->position().toPoint());
        QRegion hoverRegion;
        if (isHoverControl(oldHover) && oldHover != d->hoveredSubControl)
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options, oldHover, this);
        if (isHoverControl(d->hoveredSubControl) && d->hoveredSubControl != oldHover) {
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options,
                    d->hoveredSubControl, this);
        }

        if (isMacStyle(style()) && !hoverRegion.isEmpty())
            hoverRegion += QRegion(0, 0, width(), d->titleBarHeight(options));

        if (!hoverRegion.isEmpty())
            update(hoverRegion);
    }

    if ((mouseEvent->buttons() & Qt::LeftButton) || d->isInInteractiveMode) {
        if ((d->isResizeOperation() && d->resizeEnabled) || (d->isMoveOperation() && d->moveEnabled)) {
            // As setNewGeometry moves the window, it invalidates the pos() value of any mouse move events that are
            // currently queued in the event loop. Map to parent using globalPos() instead.
            d->setNewGeometry(parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        }
        return;
    }

    // Do not resize/move if not allowed.
    d->currentOperation = d->getOperation(mouseEvent->position().toPoint());
    if ((d->isResizeOperation() && !d->resizeEnabled) || (d->isMoveOperation() && !d->moveEnabled))
        d->currentOperation = QMdiSubWindowPrivate::None;
    d->updateCursor();
}